

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

ON_Mesh * __thiscall ON_Mesh::MeshPart(ON_Mesh *this,ON_MeshPart *mesh_part,ON_Mesh *mesh)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int face_count;
  char *sFormat;
  long lVar14;
  int iVar15;
  size_t newcap;
  long lVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  bool bHidden;
  ON_Mesh *local_d0;
  ON_MeshFace local_98;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  ON_SimpleArray<bool> *local_78;
  ON_Mesh *local_70;
  long local_68;
  ON_SimpleArray<ON_SurfaceCurvature> *local_60;
  ON_SimpleArray<ON_2dPoint> *local_58;
  ON_SimpleArray<ON_Color> *local_50;
  ON_SimpleArray<ON_2fPoint> *local_48;
  ON_SimpleArray<ON_3fVector> *local_40;
  ON_SimpleArray<ON_3fPoint> *local_38;
  
  if (this == mesh) {
    sFormat = "ON_Mesh::MeshPart this == mesh";
    iVar17 = 0x2dbf;
  }
  else {
    if (mesh != (ON_Mesh *)0x0) {
      Destroy(mesh);
    }
    iVar17 = mesh_part->fi[0];
    if (-1 < iVar17) {
      iVar15 = mesh_part->fi[1];
      iVar3 = (this->m_F).m_count;
      if (iVar17 <= iVar15 && iVar15 <= iVar3) {
        iVar4 = mesh_part->vi[0];
        if (-1 < iVar4) {
          iVar5 = mesh_part->vi[1];
          iVar6 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
          iVar18 = iVar5 - iVar4;
          if ((iVar18 != 0 && iVar4 <= iVar5) && iVar5 <= iVar6) {
            iVar4 = (this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count;
            local_88 = CONCAT31(local_88._1_3_,(this->m_H).m_count == iVar6);
            iVar5 = this->m_hidden_count;
            iVar7 = (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count;
            iVar8 = (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count;
            iVar9 = (this->m_C).m_count;
            iVar10 = (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count;
            iVar11 = (this->m_K).m_count;
            local_d0 = mesh;
            if (mesh == (ON_Mesh *)0x0) {
              local_d0 = (ON_Mesh *)operator_new(0x6e0);
              ON_Mesh(local_d0,mesh_part->triangle_count,mesh_part->vertex_count,iVar7 == iVar6,
                      iVar8 == iVar6);
            }
            newcap = (size_t)iVar18;
            if (iVar9 == iVar6) {
              ON_SimpleArray<ON_Color>::Reserve(&local_d0->m_C,newcap);
            }
            if (iVar10 == iVar6) {
              ON_SimpleArray<ON_2dPoint>::Reserve
                        (&(local_d0->m_S).super_ON_SimpleArray<ON_2dPoint>,newcap);
            }
            local_88 = CONCAT31(local_88._1_3_,(byte)local_88 & 0 < iVar5);
            if (iVar11 == iVar6) {
              ON_SimpleArray<ON_SurfaceCurvature>::Reserve(&local_d0->m_K,newcap);
            }
            bVar2 = 0 < iVar3 && iVar4 == iVar3;
            if ((byte)local_88 != '\0') {
              ON_SimpleArray<bool>::Reserve(&local_d0->m_H,newcap);
            }
            local_70 = mesh;
            if (bVar2) {
              ON_SimpleArray<ON_3fVector>::Reserve
                        (&(local_d0->m_FN).super_ON_SimpleArray<ON_3fVector>,(long)(iVar15 - iVar17)
                        );
            }
            lVar14 = (long)mesh_part->vi[0];
            iVar17 = mesh_part->vi[1];
            local_38 = &(local_d0->m_V).super_ON_SimpleArray<ON_3fPoint>;
            local_40 = &(local_d0->m_N).super_ON_SimpleArray<ON_3fVector>;
            local_48 = &(local_d0->m_T).super_ON_SimpleArray<ON_2fPoint>;
            local_50 = &local_d0->m_C;
            local_58 = &(local_d0->m_S).super_ON_SimpleArray<ON_2dPoint>;
            local_60 = &local_d0->m_K;
            local_78 = &local_d0->m_H;
            lVar21 = lVar14 * 0xc;
            lVar20 = lVar14 * 8;
            lVar16 = lVar14 * 4;
            lVar19 = lVar14 << 4;
            local_68 = lVar14;
            for (; lVar14 < iVar17; lVar14 = lVar14 + 1) {
              ON_SimpleArray<ON_3fPoint>::Append
                        (local_38,(ON_3fPoint *)
                                  ((long)&((this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a)->x +
                                  lVar21));
              if (iVar7 == iVar6) {
                ON_SimpleArray<ON_3fVector>::Append
                          (local_40,(ON_3fVector *)
                                    ((long)&((this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a)->x +
                                    lVar21));
              }
              if (iVar8 == iVar6) {
                ON_SimpleArray<ON_2fPoint>::Append
                          (local_48,(ON_2fPoint *)
                                    ((long)&((this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a)->x +
                                    lVar20));
              }
              if (iVar9 == iVar6) {
                ON_SimpleArray<ON_Color>::Append
                          (local_50,(ON_Color *)((long)&((this->m_C).m_a)->field_0 + lVar16));
              }
              if (iVar10 == iVar6) {
                ON_SimpleArray<ON_2dPoint>::Append
                          (local_58,(ON_2dPoint *)
                                    ((long)&((this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a)->x +
                                    lVar19));
              }
              if (iVar11 == iVar6) {
                ON_SimpleArray<ON_SurfaceCurvature>::Append
                          (local_60,(ON_SurfaceCurvature *)((long)&((this->m_K).m_a)->k1 + lVar19));
              }
              if ((byte)local_88 != '\0') {
                local_98.vi[0]._0_1_ = (this->m_H).m_a[lVar14];
                ON_SimpleArray<bool>::Append(local_78,(bool *)&local_98);
                if ((char)local_98.vi[0] == '\x01') {
                  local_d0->m_hidden_count = local_d0->m_hidden_count + 1;
                }
              }
              lVar21 = lVar21 + 0xc;
              lVar20 = lVar20 + 8;
              lVar16 = lVar16 + 4;
              lVar19 = lVar19 + 0x10;
            }
            if (local_d0->m_hidden_count < 1) {
              ON_SimpleArray<bool>::Destroy(local_78);
              local_d0->m_hidden_count = 0;
            }
            lVar20 = (long)mesh_part->fi[0];
            iVar17 = mesh_part->fi[1];
            local_88 = (int)local_68;
            iStack_84 = (int)local_68;
            iStack_80 = (int)local_68;
            iStack_7c = (int)local_68;
            lVar14 = lVar20 << 4;
            lVar16 = lVar20 * 0xc;
            iVar15 = 0;
            for (; lVar20 < iVar17; lVar20 = lVar20 + 1) {
              puVar1 = (undefined8 *)((long)((this->m_F).m_a)->vi + lVar14);
              uVar12 = *puVar1;
              uVar13 = puVar1[1];
              local_98.vi[0] = (int)uVar12;
              local_98.vi[1] = (int)((ulong)uVar12 >> 0x20);
              local_98.vi[2] = (int)uVar13;
              local_98.vi[3] = (int)((ulong)uVar13 >> 0x20);
              local_98.vi[0] = local_98.vi[0] - local_88;
              local_98.vi[1] = local_98.vi[1] - iStack_84;
              local_98.vi[2] = local_98.vi[2] - iStack_80;
              local_98.vi[3] = local_98.vi[3] - iStack_7c;
              if ((((local_98.vi[0] < 0 || iVar18 <= local_98.vi[0]) ||
                   (local_98.vi[1] < 0 || iVar18 <= local_98.vi[1])) ||
                  (local_98.vi[2] < 0 || iVar18 <= local_98.vi[2])) ||
                 (iVar18 <= local_98.vi[3] || local_98.vi[3] < 0)) {
                iVar15 = iVar15 + 1;
                ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                           ,0x2e26,"","ON_Mesh::MeshPart Invalid face in partition");
              }
              else {
                ON_SimpleArray<ON_MeshFace>::Append(&local_d0->m_F,&local_98);
                if (bVar2) {
                  ON_SimpleArray<ON_3fVector>::Append
                            (&(local_d0->m_FN).super_ON_SimpleArray<ON_3fVector>,
                             (ON_3fVector *)
                             ((long)&((this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_a)->x +
                             lVar16));
                }
              }
              lVar14 = lVar14 + 0x10;
              lVar16 = lVar16 + 0xc;
            }
            if (0 < (local_d0->m_F).m_count || iVar15 < 1) {
              return local_d0;
            }
            if (local_d0 == local_70) {
              Destroy(local_70);
            }
            else {
              (*(local_d0->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(local_d0);
            }
            return (ON_Mesh *)0x0;
          }
        }
        sFormat = "ON_Mesh::MeshPart mesh_part.vi[] is not valid";
        iVar17 = 0x2dd4;
        goto LAB_00523b81;
      }
    }
    sFormat = "ON_Mesh::MeshPart mesh_part.fi[] is not valid";
    iVar17 = 0x2dcb;
  }
LAB_00523b81:
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
             ,iVar17,"",sFormat);
  return (ON_Mesh *)0x0;
}

Assistant:

ON_Mesh* ON_Mesh::MeshPart( 
  const ON_MeshPart& mesh_part,
  ON_Mesh* mesh 
  ) const
{
  if ( this == mesh )
  {
    ON_ERROR("ON_Mesh::MeshPart this == mesh");
    return 0;
  }

  if ( mesh )
    mesh->Destroy();

  if (    mesh_part.fi[0] < 0 
       || mesh_part.fi[1] > m_F.Count()
       || mesh_part.fi[0] > mesh_part.fi[1]
       )
  {
    ON_ERROR("ON_Mesh::MeshPart mesh_part.fi[] is not valid");
    return 0;
  }

  if (    mesh_part.vi[0] < 0
       || mesh_part.vi[1] > m_V.Count()
       || mesh_part.vi[0] >= mesh_part.vi[1]
       )
  {
    ON_ERROR("ON_Mesh::MeshPart mesh_part.vi[] is not valid");
    return 0;
  }

  const int submesh_V_count = mesh_part.vi[1] - mesh_part.vi[0];
  const int submesh_F_count = mesh_part.fi[1] - mesh_part.fi[0];

  const bool bHasVertexNormals = HasVertexNormals();
  const bool bHasTextureCoordinates = HasTextureCoordinates();
  const bool bHasVertexColors = HasVertexColors();
  const bool bHasFaceNormals = HasFaceNormals();
  const bool bHasSurfaceParameters = HasSurfaceParameters();
  const bool bHasPrincipalCurvatures = HasPrincipalCurvatures();
  const bool bHasHiddenVertices = HiddenVertexCount() > 0;

  ON_Mesh* submesh = (0 != mesh)
                   ? mesh
                   : new ON_Mesh(mesh_part.triangle_count,
                                 mesh_part.vertex_count,
                                 bHasVertexNormals,
                                 bHasTextureCoordinates
                                 );

  if ( bHasVertexColors )
    submesh->m_C.Reserve(submesh_V_count);
  if ( bHasSurfaceParameters )
    submesh->m_S.Reserve(submesh_V_count);
  if ( bHasPrincipalCurvatures )
    submesh->m_K.Reserve(submesh_V_count);
  if ( bHasHiddenVertices )
    submesh->m_H.Reserve(submesh_V_count);
  if ( bHasFaceNormals )
    submesh->m_FN.Reserve(submesh_F_count);

  // put vertex information into submesh
  const int vi0 = mesh_part.vi[0];
  const int vi1 = mesh_part.vi[1];
  for ( int vi = vi0; vi < vi1; vi++ )
  {
    submesh->m_V.Append(m_V[vi]);
    if ( bHasVertexNormals )
      submesh->m_N.Append(m_N[vi]);
    if ( bHasTextureCoordinates )
      submesh->m_T.Append(m_T[vi]);
    if ( bHasVertexColors )
      submesh->m_C.Append(m_C[vi]);
    if ( bHasSurfaceParameters )
      submesh->m_S.Append(m_S[vi]);
    if ( bHasPrincipalCurvatures )
      submesh->m_K.Append(m_K[vi]);
    if ( bHasHiddenVertices )
    {
      bool bHidden = m_H[vi];
      submesh->m_H.Append(bHidden);
      if ( bHidden )
        submesh->m_hidden_count++;
    }
  }
  if ( submesh->m_hidden_count <= 0 )
  {
    submesh->m_H.Destroy();
    submesh->m_hidden_count = 0;
  }

  // put face information into submesh
  int bad_face_count = 0;
  const int fi0 = mesh_part.fi[0];
  const int fi1 = mesh_part.fi[1];
  for ( int fi = fi0; fi < fi1; fi++ )
  {
    ON_MeshFace f = m_F[fi];
    f.vi[0] -= vi0;
    f.vi[1] -= vi0;
    f.vi[2] -= vi0;
    f.vi[3] -= vi0;
    if (    f.vi[0] >= submesh_V_count || f.vi[0] < 0 
         || f.vi[1] >= submesh_V_count || f.vi[1] < 0 
         || f.vi[2] >= submesh_V_count || f.vi[2] < 0 
         || f.vi[3] >= submesh_V_count || f.vi[3] < 0 
         )
    {
      bad_face_count++;
      ON_ERROR("ON_Mesh::MeshPart Invalid face in partition");
      continue;
    }
    submesh->m_F.Append(f);
    if ( bHasFaceNormals )
      submesh->m_FN.Append(m_FN[fi]);
  }

  if ( submesh->m_F.Count() < 1 && bad_face_count > 0 )
  {
    if ( submesh != mesh )
      delete submesh;
    else
      mesh->Destroy();

    submesh = 0;
  }

  return submesh;
}